

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

void Abc_TtImplementNpnConfig(word *pTruth,int nVars,char *pCanonPerm,uint uCanonPhase)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int nWords;
  uint iVar;
  
  nWords = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    nWords = 1;
  }
  if ((uCanonPhase >> (nVars & 0x1fU) & 1) != 0) {
    Abc_TtNot(pTruth,nWords);
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar2 = uVar3;
  }
  while (iVar = (uint)uVar3, (uint)uVar2 != iVar) {
    if ((uCanonPhase >> (iVar & 0x1f) & 1) != 0) {
      Abc_TtFlip(pTruth,nWords,iVar);
    }
    uVar3 = (ulong)(iVar + 1);
  }
  if (pCanonPerm != (char *)0x0) {
    for (uVar3 = 0; uVar4 = uVar3, uVar3 != uVar2; uVar3 = uVar3 + 1) {
      while( true ) {
        if ((uint)nVars == uVar4) {
          __assert_fail("k < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                        ,0x690,"void Abc_TtImplementNpnConfig(word *, int, char *, unsigned int)");
        }
        if (uVar3 == (uint)(int)pCanonPerm[uVar4]) break;
        uVar4 = uVar4 + 1;
      }
      if (uVar3 != (uVar4 & 0xffffffff)) {
        Abc_TtSwapVars(pTruth,nVars,(int)uVar3,(int)uVar4);
        cVar1 = pCanonPerm[uVar3];
        pCanonPerm[uVar3] = pCanonPerm[uVar4];
        pCanonPerm[uVar4] = cVar1;
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtImplementNpnConfig( word * pTruth, int nVars, char * pCanonPerm, unsigned uCanonPhase )
{
    int i, k, nWords = Abc_TtWordNum( nVars );
    if ( (uCanonPhase >> nVars) & 1 )
        Abc_TtNot( pTruth, nWords );
    for ( i = 0; i < nVars; i++ )
        if ( (uCanonPhase >> i) & 1 )
            Abc_TtFlip( pTruth, nWords, i );
    if ( pCanonPerm )
    for ( i = 0; i < nVars; i++ )
    {
        for ( k = i; k < nVars; k++ )
            if ( pCanonPerm[k] == i )
                break;
        assert( k < nVars );
        if ( i == k )
            continue;
        Abc_TtSwapVars( pTruth, nVars, i, k );
        ABC_SWAP( int, pCanonPerm[i], pCanonPerm[k] );
    }
}